

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O2

void sSetRWork(int m,int panel_size,float *dworkptr,float **dense,float **tempv)

{
  int iVar1;
  int iVar2;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  iVar1 = sp_ienv((uint)(iVar1 <= iVar2) * 4 + 3);
  iVar2 = sp_ienv(4);
  *dense = dworkptr;
  *tempv = dworkptr + panel_size * m;
  sfill(*dense,panel_size * m,0.0);
  iVar1 = (iVar2 + iVar1) * panel_size;
  if (iVar1 <= m) {
    iVar1 = m;
  }
  sfill(*tempv,iVar1,0.0);
  return;
}

Assistant:

void
sSetRWork(int m, int panel_size, float *dworkptr,
	 float **dense, float **tempv)
{
    float zero = 0.0;

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    sfill (*dense, m * panel_size, zero);
    sfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}